

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  pointer pRVar6;
  pointer pRVar7;
  pointer pRVar8;
  byte *pbVar9;
  byte bVar10;
  
  bVar10 = 0;
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar2 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar5 = pbVar2 + sVar1 * 0x48;
  if (*(byte **)(dst + 8) < pbVar5) {
    pbVar3 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x48,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_00346b84;
    pRVar8 = this->data_;
    pRVar7 = pRVar8 + sVar1;
    pbVar5 = pbVar3 + sVar1 * 0x48;
    pbVar2 = pbVar3;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar5;
    pRVar8 = this->data_;
    pRVar7 = pRVar8 + sVar1;
    pbVar3 = pbVar2;
  }
  do {
    pbVar9 = pbVar2 + 0x48;
    pRVar6 = pRVar8;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(StatementBlockSymbol **)pbVar2 = (pRVar6->ruleBlock).ptr;
      pRVar6 = (pointer)((long)pRVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      pbVar2 = pbVar2 + (ulong)bVar10 * -0x10 + 8;
    }
  } while ((pRVar8 + 1 != pRVar7) && (pRVar8 = pRVar8 + 1, pbVar2 = pbVar9, pbVar9 != pbVar5));
LAB_00346b84:
  return (int)pbVar3;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }